

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int deflate_nv(nghttp2_hd_deflater *deflater,nghttp2_bufs *bufs,nghttp2_nv *nv)

{
  nghttp2_mem *mem_00;
  int32_t token_00;
  int iVar1;
  size_t idx_00;
  search_result sVar2;
  int local_a4;
  nghttp2_hd_nv local_a0;
  undefined1 local_88 [8];
  nghttp2_hd_nv hd_nv;
  uint32_t local_5c;
  uint32_t hash;
  nghttp2_mem *mem;
  int32_t token;
  int indexing_mode;
  ssize_t idx;
  search_result res;
  int rv;
  nghttp2_nv *nv_local;
  nghttp2_bufs *bufs_local;
  nghttp2_hd_deflater *deflater_local;
  
  local_5c = 0;
  mem_00 = (deflater->ctx).mem;
  token_00 = lookup_token(nv->name,nv->namelen);
  if (token_00 == -1) {
    local_5c = name_hash(nv);
  }
  else if (token_00 < 0x3d) {
    local_5c = static_table[token_00].hash;
  }
  if ((token_00 == 0x16) ||
     (((token_00 == 0x1f && (nv->valuelen < 0x14)) || ((nv->flags & 1) != 0)))) {
    local_a4 = 2;
  }
  else {
    local_a4 = hd_deflate_decide_indexing(deflater,nv,token_00);
  }
  sVar2 = search_hd_table(&deflater->ctx,nv,token_00,local_a4,&deflater->map,local_5c);
  idx_00 = sVar2.index;
  hd_nv._16_8_ = idx_00;
  if (sVar2.name_value_match != 0) {
    iVar1 = emit_indexed_block(bufs,idx_00);
    if (iVar1 != 0) {
      return iVar1;
    }
    return 0;
  }
  if (local_a4 == 0) {
    if (idx_00 == 0xffffffffffffffff) {
      iVar1 = nghttp2_rcbuf_new2((nghttp2_rcbuf **)local_88,nv->name,nv->namelen,mem_00);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      nghttp2_hd_table_get(&local_a0,&deflater->ctx,idx_00);
      local_88 = (undefined1  [8])local_a0.name;
      nghttp2_rcbuf_incref(local_a0.name);
    }
    iVar1 = nghttp2_rcbuf_new2(&hd_nv.name,nv->value,nv->valuelen,mem_00);
    if (iVar1 != 0) {
      nghttp2_rcbuf_decref((nghttp2_rcbuf *)local_88);
      return iVar1;
    }
    hd_nv.value._4_1_ = 0;
    hd_nv.value._0_4_ = token_00;
    iVar1 = add_hd_table_incremental
                      (&deflater->ctx,(nghttp2_hd_nv *)local_88,&deflater->map,local_5c);
    nghttp2_rcbuf_decref(hd_nv.name);
    nghttp2_rcbuf_decref((nghttp2_rcbuf *)local_88);
    if (iVar1 != 0) {
      return -0x20b;
    }
  }
  if (idx_00 == 0xffffffffffffffff) {
    res._12_4_ = emit_newname_block(bufs,nv,local_a4);
  }
  else {
    res._12_4_ = emit_indname_block(bufs,idx_00,nv,local_a4);
  }
  if (res._12_4_ == 0) {
    deflater_local._4_4_ = 0;
  }
  else {
    deflater_local._4_4_ = res._12_4_;
  }
  return deflater_local._4_4_;
}

Assistant:

static int deflate_nv(nghttp2_hd_deflater *deflater, nghttp2_bufs *bufs,
                      const nghttp2_nv *nv) {
  int rv;
  search_result res;
  ssize_t idx;
  int indexing_mode;
  int32_t token;
  nghttp2_mem *mem;
  uint32_t hash = 0;

  DEBUGF("deflatehd: deflating %.*s: %.*s\n", (int)nv->namelen, nv->name,
         (int)nv->valuelen, nv->value);

  mem = deflater->ctx.mem;

  token = lookup_token(nv->name, nv->namelen);
  if (token == -1) {
    hash = name_hash(nv);
  } else if (token <= NGHTTP2_TOKEN_WWW_AUTHENTICATE) {
    hash = static_table[token].hash;
  }

  /* Don't index authorization header field since it may contain low
     entropy secret data (e.g., id/password).  Also cookie header
     field with less than 20 bytes value is also never indexed.  This
     is the same criteria used in Firefox codebase. */
  indexing_mode =
      token == NGHTTP2_TOKEN_AUTHORIZATION ||
              (token == NGHTTP2_TOKEN_COOKIE && nv->valuelen < 20) ||
              (nv->flags & NGHTTP2_NV_FLAG_NO_INDEX)
          ? NGHTTP2_HD_NEVER_INDEXING
          : hd_deflate_decide_indexing(deflater, nv, token);

  res = search_hd_table(&deflater->ctx, nv, token, indexing_mode,
                        &deflater->map, hash);

  idx = res.index;

  if (res.name_value_match) {

    DEBUGF("deflatehd: name/value match index=%zd\n", idx);

    rv = emit_indexed_block(bufs, (size_t)idx);
    if (rv != 0) {
      return rv;
    }

    return 0;
  }

  if (res.index != -1) {
    DEBUGF("deflatehd: name match index=%zd\n", res.index);
  }

  if (indexing_mode == NGHTTP2_HD_WITH_INDEXING) {
    nghttp2_hd_nv hd_nv;

    if (idx != -1) {
      hd_nv.name = nghttp2_hd_table_get(&deflater->ctx, (size_t)idx).name;
      nghttp2_rcbuf_incref(hd_nv.name);
    } else {
      rv = nghttp2_rcbuf_new2(&hd_nv.name, nv->name, nv->namelen, mem);
      if (rv != 0) {
        return rv;
      }
    }

    rv = nghttp2_rcbuf_new2(&hd_nv.value, nv->value, nv->valuelen, mem);

    if (rv != 0) {
      nghttp2_rcbuf_decref(hd_nv.name);
      return rv;
    }

    hd_nv.token = token;
    hd_nv.flags = NGHTTP2_NV_FLAG_NONE;

    rv = add_hd_table_incremental(&deflater->ctx, &hd_nv, &deflater->map, hash);

    nghttp2_rcbuf_decref(hd_nv.value);
    nghttp2_rcbuf_decref(hd_nv.name);

    if (rv != 0) {
      return NGHTTP2_ERR_HEADER_COMP;
    }
  }
  if (idx == -1) {
    rv = emit_newname_block(bufs, nv, indexing_mode);
  } else {
    rv = emit_indname_block(bufs, (size_t)idx, nv, indexing_mode);
  }
  if (rv != 0) {
    return rv;
  }

  return 0;
}